

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::ValidateFieldOptions
          (DescriptorBuilder *this,FieldDescriptor *field,FieldDescriptorProto *proto)

{
  bool bVar1;
  Type TVar2;
  Descriptor *pDVar3;
  FieldOptions *pFVar4;
  MessageOptions *pMVar5;
  MessageOptions *pMVar6;
  FileDescriptor *pFVar7;
  string *input;
  string *psVar8;
  bool local_5a;
  bool local_59;
  bool local_41;
  string local_40;
  FieldDescriptorProto *local_20;
  FieldDescriptorProto *proto_local;
  FieldDescriptor *field_local;
  DescriptorBuilder *this_local;
  
  local_20 = proto;
  proto_local = (FieldDescriptorProto *)field;
  field_local = (FieldDescriptor *)this;
  if (((this->pool_->lazily_build_dependencies_ & 1U) == 0) ||
     ((field != (FieldDescriptor *)0x0 &&
      (pDVar3 = FieldDescriptor::message_type(field), pDVar3 != (Descriptor *)0x0)))) {
    pFVar4 = FieldDescriptor::options((FieldDescriptor *)proto_local);
    bVar1 = FieldOptions::lazy(pFVar4);
    if ((bVar1) &&
       (TVar2 = FieldDescriptor::type((FieldDescriptor *)proto_local), TVar2 != TYPE_MESSAGE)) {
      psVar8 = FieldDescriptor::full_name_abi_cxx11_((FieldDescriptor *)proto_local);
      AddError(this,psVar8,&local_20->super_Message,TYPE,
               "[lazy = true] can only be specified for submessage fields.");
    }
    pFVar4 = FieldDescriptor::options((FieldDescriptor *)proto_local);
    bVar1 = FieldOptions::packed(pFVar4);
    if ((bVar1) && (bVar1 = FieldDescriptor::is_packable((FieldDescriptor *)proto_local), !bVar1)) {
      psVar8 = FieldDescriptor::full_name_abi_cxx11_((FieldDescriptor *)proto_local);
      AddError(this,psVar8,&local_20->super_Message,TYPE,
               "[packed = true] can only be specified for repeated primitive fields.");
    }
    if ((proto_local->extendee_).tagged_ptr_.ptr_ != (void *)0x0) {
      pDVar3 = FieldDescriptor::containing_type((FieldDescriptor *)proto_local);
      pMVar5 = Descriptor::options(pDVar3);
      pMVar6 = MessageOptions::default_instance();
      if (pMVar5 != pMVar6) {
        pDVar3 = FieldDescriptor::containing_type((FieldDescriptor *)proto_local);
        pMVar5 = Descriptor::options(pDVar3);
        bVar1 = MessageOptions::message_set_wire_format(pMVar5);
        if (bVar1) {
          bVar1 = FieldDescriptor::is_extension((FieldDescriptor *)proto_local);
          if (bVar1) {
            bVar1 = FieldDescriptor::is_optional((FieldDescriptor *)proto_local);
            if ((!bVar1) ||
               (TVar2 = FieldDescriptor::type((FieldDescriptor *)proto_local), TVar2 != TYPE_MESSAGE
               )) {
              psVar8 = FieldDescriptor::full_name_abi_cxx11_((FieldDescriptor *)proto_local);
              AddError(this,psVar8,&local_20->super_Message,TYPE,
                       "Extensions of MessageSets must be optional messages.");
            }
          }
          else {
            psVar8 = FieldDescriptor::full_name_abi_cxx11_((FieldDescriptor *)proto_local);
            AddError(this,psVar8,&local_20->super_Message,NAME,
                     "MessageSets cannot have fields, only extensions.");
          }
        }
      }
    }
    pFVar7 = FieldDescriptor::file((FieldDescriptor *)proto_local);
    bVar1 = IsLite(pFVar7);
    if ((bVar1) && ((proto_local->extendee_).tagged_ptr_.ptr_ != (void *)0x0)) {
      pDVar3 = FieldDescriptor::containing_type((FieldDescriptor *)proto_local);
      pFVar7 = Descriptor::file(pDVar3);
      bVar1 = IsLite(pFVar7);
      if (!bVar1) {
        psVar8 = FieldDescriptor::full_name_abi_cxx11_((FieldDescriptor *)proto_local);
        AddError(this,psVar8,&local_20->super_Message,EXTENDEE,
                 "Extensions to non-lite types can only be declared in non-lite files.  Note that you cannot extend a non-lite type to contain a lite type, but the reverse is allowed."
                );
      }
    }
    bVar1 = FieldDescriptor::is_map((FieldDescriptor *)proto_local);
    if ((bVar1) && (bVar1 = ValidateMapEntry(this,(FieldDescriptor *)proto_local,local_20), !bVar1))
    {
      psVar8 = FieldDescriptor::full_name_abi_cxx11_((FieldDescriptor *)proto_local);
      AddError(this,psVar8,&local_20->super_Message,TYPE,
               "map_entry should not be set explicitly. Use map<KeyType, ValueType> instead.");
    }
    ValidateJSType(this,(FieldDescriptor *)proto_local,local_20);
    bVar1 = FieldDescriptor::is_extension((FieldDescriptor *)proto_local);
    local_41 = false;
    local_59 = false;
    if (bVar1) {
      local_41 = FieldDescriptor::has_json_name((FieldDescriptor *)proto_local);
      local_5a = false;
      if (local_41) {
        psVar8 = FieldDescriptor::json_name_abi_cxx11_((FieldDescriptor *)proto_local);
        input = FieldDescriptor::name_abi_cxx11_((FieldDescriptor *)proto_local);
        anon_unknown_1::ToJsonName(&local_40,input);
        local_5a = std::operator!=(psVar8,&local_40);
      }
      local_59 = local_5a;
    }
    if (local_41 != false) {
      std::__cxx11::string::~string((string *)&local_40);
    }
    if (local_59 != false) {
      psVar8 = FieldDescriptor::full_name_abi_cxx11_((FieldDescriptor *)proto_local);
      AddError(this,psVar8,&local_20->super_Message,OPTION_NAME,
               "option json_name is not allowed on extension fields.");
    }
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateFieldOptions(
    FieldDescriptor* field, const FieldDescriptorProto& proto) {
  if (pool_->lazily_build_dependencies_ && (!field || !field->message_type())) {
    return;
  }
  // Only message type fields may be lazy.
  if (field->options().lazy()) {
    if (field->type() != FieldDescriptor::TYPE_MESSAGE) {
      AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
               "[lazy = true] can only be specified for submessage fields.");
    }
  }

  // Only repeated primitive fields may be packed.
  if (field->options().packed() && !field->is_packable()) {
    AddError(
        field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
        "[packed = true] can only be specified for repeated primitive fields.");
  }

  // Note:  Default instance may not yet be initialized here, so we have to
  //   avoid reading from it.
  if (field->containing_type_ != nullptr &&
      &field->containing_type()->options() !=
          &MessageOptions::default_instance() &&
      field->containing_type()->options().message_set_wire_format()) {
    if (field->is_extension()) {
      if (!field->is_optional() ||
          field->type() != FieldDescriptor::TYPE_MESSAGE) {
        AddError(field->full_name(), proto,
                 DescriptorPool::ErrorCollector::TYPE,
                 "Extensions of MessageSets must be optional messages.");
      }
    } else {
      AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::NAME,
               "MessageSets cannot have fields, only extensions.");
    }
  }

  // Lite extensions can only be of Lite types.
  if (IsLite(field->file()) && field->containing_type_ != nullptr &&
      !IsLite(field->containing_type()->file())) {
    AddError(field->full_name(), proto,
             DescriptorPool::ErrorCollector::EXTENDEE,
             "Extensions to non-lite types can only be declared in non-lite "
             "files.  Note that you cannot extend a non-lite type to contain "
             "a lite type, but the reverse is allowed.");
  }

  // Validate map types.
  if (field->is_map()) {
    if (!ValidateMapEntry(field, proto)) {
      AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
               "map_entry should not be set explicitly. Use map<KeyType, "
               "ValueType> instead.");
    }
  }

  ValidateJSType(field, proto);

  // json_name option is not allowed on extension fields. Note that the
  // json_name field in FieldDescriptorProto is always populated by protoc
  // when it sends descriptor data to plugins (calculated from field name if
  // the option is not explicitly set) so we can't rely on its presence to
  // determine whether the json_name option is set on the field. Here we
  // compare it against the default calculated json_name value and consider
  // the option set if they are different. This won't catch the case when
  // an user explicitly sets json_name to the default value, but should be
  // good enough to catch common misuses.
  if (field->is_extension() &&
      (field->has_json_name() &&
       field->json_name() != ToJsonName(field->name()))) {
    AddError(field->full_name(), proto,
             DescriptorPool::ErrorCollector::OPTION_NAME,
             "option json_name is not allowed on extension fields.");
  }

}